

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode cr_mime_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                     _Bool *peos)

{
  bufq *q;
  int *piVar1;
  void *pvVar2;
  curl_trc_feat *pcVar3;
  _Bool *p_Var4;
  _Bool _Var5;
  ulong uVar6;
  size_t len;
  ssize_t sVar7;
  long lVar8;
  char *pcVar9;
  CURLcode result;
  _Bool *local_140;
  char tmp [256];
  
  pvVar2 = reader->ctx;
  if ((*(byte *)((long)pvVar2 + 0x80) & 2) != 0) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) is errored -> %d, eos=0",blen,
                    (ulong)*(uint *)((long)pvVar2 + 0x38));
    }
    *pnread = 0;
    *peos = false;
    return *(CURLcode *)((long)pvVar2 + 0x38);
  }
  if ((*(byte *)((long)pvVar2 + 0x80) & 1) != 0) {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_read.log_level)))) {
      Curl_trc_read(data,"cr_mime_read(len=%zu) seen eos -> 0, eos=1",blen);
    }
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  lVar8 = *(long *)((long)pvVar2 + 0x28);
  if (-1 < lVar8) {
    uVar6 = lVar8 - *(long *)((long)pvVar2 + 0x30);
    if (uVar6 == 0 || lVar8 < *(long *)((long)pvVar2 + 0x30)) {
      blen = 0;
    }
    else if ((long)uVar6 < (long)blen) {
      blen = uVar6;
    }
  }
  q = (bufq *)((long)pvVar2 + 0x40);
  local_140 = peos;
  _Var5 = Curl_bufq_is_empty(q);
  if (_Var5) {
    if (blen < 5) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) && (0 < Curl_trc_feat_read.log_level)) {
        pcVar9 = "cr_mime_read(len=%zu), small read, using tmp";
        Curl_trc_read(data,"cr_mime_read(len=%zu), small read, using tmp",blen);
        reader = (Curl_creader *)pcVar9;
      }
      len = Curl_mime_read(tmp,(size_t)reader,0x100,*(void **)((long)pvVar2 + 0x20));
      if (len < 0x101) {
        result = CURLE_OK;
        sVar7 = Curl_bufq_write(q,(uchar *)tmp,len,&result);
        if ((sVar7 < 0) || (len = Curl_bufq_read(q,(uchar *)buf,blen,&result), (long)len < 0)) {
          *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
          goto LAB_0013ff0c;
        }
      }
    }
    else {
      len = Curl_mime_read(buf,(size_t)reader,blen,*(void **)((long)pvVar2 + 0x20));
    }
  }
  else {
    tmp[0] = '\0';
    tmp[1] = '\0';
    tmp[2] = '\0';
    tmp[3] = '\0';
    len = Curl_bufq_read(q,(uchar *)buf,blen,(CURLcode *)tmp);
    if ((long)len < 0) {
      *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
      result = tmp._0_4_;
LAB_0013ff0c:
      *(CURLcode *)((long)pvVar2 + 0x38) = result;
      return result;
    }
  }
  p_Var4 = local_140;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"cr_mime_read(len=%zu), mime_read() -> %zd",blen,len);
  }
  if (1 < len + 2) {
    if (len == 0x10000001) {
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
          ) && (0 < Curl_trc_feat_read.log_level)) {
        Curl_trc_read(data,"cr_mime_read(len=%zu), paused by callback",blen);
      }
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 0x20;
      *pnread = 0;
      *p_Var4 = false;
    }
    else {
      if (len == 0x10000000) {
        Curl_failf(data,"operation aborted by callback");
        *pnread = 0;
        *p_Var4 = false;
        *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
        *(undefined4 *)((long)pvVar2 + 0x38) = 0x2a;
        return CURLE_ABORTED_BY_CALLBACK;
      }
      if (len == 0) {
        if ((-1 < *(long *)((long)pvVar2 + 0x28)) &&
           (*(long *)((long)pvVar2 + 0x30) < *(long *)((long)pvVar2 + 0x28))) {
          Curl_failf(data,"client mime read EOF fail, only %ld/%ld of needed bytes read");
          return CURLE_READ_ERROR;
        }
        *pnread = 0;
        *p_Var4 = true;
        *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 1;
      }
      else {
        if (blen < len) {
          pcVar9 = "read function returned funny value";
          goto LAB_0013ffce;
        }
        lVar8 = *(long *)((long)pvVar2 + 0x30) + len;
        *(long *)((long)pvVar2 + 0x30) = lVar8;
        if (-1 < *(long *)((long)pvVar2 + 0x28)) {
          *(byte *)((long)pvVar2 + 0x80) =
               *(byte *)((long)pvVar2 + 0x80) & 0xfe | *(long *)((long)pvVar2 + 0x28) <= lVar8;
        }
        *pnread = len;
        *p_Var4 = (_Bool)(*(byte *)((long)pvVar2 + 0x80) & 1);
      }
      if (data == (Curl_easy *)0x0) {
        return CURLE_OK;
      }
    }
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
        (0 < Curl_trc_feat_read.log_level)))) {
      Curl_trc_read(data,"cr_mime_read(len=%zu, total=%ld, read=%ld) -> %d, %zu, %d",blen,
                    *(undefined8 *)((long)pvVar2 + 0x28),*(undefined8 *)((long)pvVar2 + 0x30),0,
                    *pnread,(ulong)*local_140);
    }
    return CURLE_OK;
  }
  pcVar9 = "read error getting mime data";
LAB_0013ffce:
  Curl_failf(data,pcVar9);
  *pnread = 0;
  *p_Var4 = false;
  *(byte *)((long)pvVar2 + 0x80) = *(byte *)((long)pvVar2 + 0x80) | 2;
  *(undefined4 *)((long)pvVar2 + 0x38) = 0x1a;
  return CURLE_READ_ERROR;
}

Assistant:

static CURLcode cr_mime_read(struct Curl_easy *data,
                             struct Curl_creader *reader,
                             char *buf, size_t blen,
                             size_t *pnread, bool *peos)
{
  struct cr_mime_ctx *ctx = reader->ctx;
  size_t nread;
  char tmp[256];


  /* Once we have errored, we will return the same error forever */
  if(ctx->errored) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) is errored -> %d, eos=0",
                  blen, ctx->error_result);
    *pnread = 0;
    *peos = FALSE;
    return ctx->error_result;
  }
  if(ctx->seen_eos) {
    CURL_TRC_READ(data, "cr_mime_read(len=%zu) seen eos -> 0, eos=1", blen);
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }
  /* respect length limitations */
  if(ctx->total_len >= 0) {
    curl_off_t remain = ctx->total_len - ctx->read_len;
    if(remain <= 0)
      blen = 0;
    else if(remain < (curl_off_t)blen)
      blen = (size_t)remain;
  }

  if(!Curl_bufq_is_empty(&ctx->tmpbuf)) {
    CURLcode result = CURLE_OK;
    ssize_t n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen,
                               &result);
    if(n < 0) {
      ctx->errored = TRUE;
      ctx->error_result = result;
      return result;
    }
    nread = (size_t)n;
  }
  else if(blen <= 4) {
    /* Curl_mime_read() may go into an infinite loop when reading
     * via a base64 encoder, as it stalls when the read buffer is too small
     * to contain a complete 3 byte encoding. Read into a larger buffer
     * and use that until empty. */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), small read, using tmp", blen);
    nread = Curl_mime_read(tmp, 1, sizeof(tmp), ctx->part);
    if(nread <= sizeof(tmp)) {
      CURLcode result = CURLE_OK;
      ssize_t n = Curl_bufq_write(&ctx->tmpbuf, (unsigned char *)tmp, nread,
                                  &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      /* stored it, read again */
      n = Curl_bufq_read(&ctx->tmpbuf, (unsigned char *)buf, blen, &result);
      if(n < 0) {
        ctx->errored = TRUE;
        ctx->error_result = result;
        return result;
      }
      nread = (size_t)n;
    }
  }
  else
    nread = Curl_mime_read(buf, 1, blen, ctx->part);

  CURL_TRC_READ(data, "cr_mime_read(len=%zu), mime_read() -> %zd",
                blen, nread);

  switch(nread) {
  case 0:
    if((ctx->total_len >= 0) && (ctx->read_len < ctx->total_len)) {
      failf(data, "client mime read EOF fail, "
            "only %"FMT_OFF_T"/%"FMT_OFF_T
            " of needed bytes read", ctx->read_len, ctx->total_len);
      return CURLE_READ_ERROR;
    }
    *pnread = 0;
    *peos = TRUE;
    ctx->seen_eos = TRUE;
    break;

  case CURL_READFUNC_ABORT:
    failf(data, "operation aborted by callback");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_ABORTED_BY_CALLBACK;
    return CURLE_ABORTED_BY_CALLBACK;

  case CURL_READFUNC_PAUSE:
    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    CURL_TRC_READ(data, "cr_mime_read(len=%zu), paused by callback", blen);
    data->req.keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    *pnread = 0;
    *peos = FALSE;
    break; /* nothing was read */

  case STOP_FILLING:
  case READ_ERROR:
    failf(data, "read error getting mime data");
    *pnread = 0;
    *peos = FALSE;
    ctx->errored = TRUE;
    ctx->error_result = CURLE_READ_ERROR;
    return CURLE_READ_ERROR;

  default:
    if(nread > blen) {
      /* the read function returned a too large value */
      failf(data, "read function returned funny value");
      *pnread = 0;
      *peos = FALSE;
      ctx->errored = TRUE;
      ctx->error_result = CURLE_READ_ERROR;
      return CURLE_READ_ERROR;
    }
    ctx->read_len += nread;
    if(ctx->total_len >= 0)
      ctx->seen_eos = (ctx->read_len >= ctx->total_len);
    *pnread = nread;
    *peos = ctx->seen_eos;
    break;
  }

  CURL_TRC_READ(data, "cr_mime_read(len=%zu, total=%" FMT_OFF_T
                ", read=%"FMT_OFF_T") -> %d, %zu, %d",
                blen, ctx->total_len, ctx->read_len, CURLE_OK, *pnread, *peos);
  return CURLE_OK;
}